

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

void Gia_DeriveFormula_rec(Gia_Man_t *pGia,char **ppNamesIn,Vec_Str_t *vStr,int iLit)

{
  uint *puVar1;
  char cVar2;
  char Entry;
  uint uVar3;
  int iVar4;
  int iVar5;
  Gia_Obj_t *pObj;
  char *format;
  
  uVar3 = Abc_Lit2Var(iLit);
  format = (char *)(ulong)uVar3;
  pObj = Gia_ManObj(pGia,uVar3);
  iVar4 = Abc_LitIsCompl(iLit);
  if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
    Vec_StrPush(vStr,'(');
    iVar5 = Gia_ObjId(pGia,pObj);
    if ((pGia->pMuxes == (uint *)0x0) || (pGia->pMuxes[iVar5] == 0)) {
      iVar5 = Gia_ObjFaninLit0p(pGia,pObj);
      iVar5 = Abc_LitNotCond(iVar5,iVar4);
      Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,iVar5);
      uVar3 = (uint)*(undefined8 *)pObj;
      if ((int)uVar3 < 0 || (~uVar3 & 0x1fffffff) == 0) {
        Entry = '|';
        if (iVar4 == 0) {
          Entry = '&';
        }
      }
      else {
        cVar2 = '|';
        if (iVar4 == 0) {
          cVar2 = '&';
        }
        Entry = '^';
        if (((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff) <= (uVar3 & 0x1fffffff)) {
          Entry = cVar2;
        }
      }
      Vec_StrPush(vStr,Entry);
      uVar3 = Gia_ObjFaninLit1p(pGia,pObj);
    }
    else {
      iVar5 = Gia_ObjFaninLit0p(pGia,pObj);
      Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,iVar5);
      Vec_StrPush(vStr,'?');
      iVar5 = Gia_ObjFaninLit1p(pGia,pObj);
      iVar5 = Abc_LitNotCond(iVar5,iVar4);
      Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,iVar5);
      Vec_StrPush(vStr,':');
      puVar1 = pGia->pMuxes;
      uVar3 = 0xffffffff;
      if ((puVar1 != (uint *)0x0) && (iVar5 = Gia_ObjId(pGia,pObj), puVar1[iVar5] != 0)) {
        puVar1 = pGia->pMuxes;
        iVar5 = Gia_ObjId(pGia,pObj);
        uVar3 = puVar1[iVar5];
      }
    }
    iVar4 = Abc_LitNotCond(uVar3,iVar4);
    Gia_DeriveFormula_rec(pGia,ppNamesIn,vStr,iVar4);
    Vec_StrPush(vStr,')');
    return;
  }
  if (iVar4 != 0) {
    format = (char *)0x7e;
    Vec_StrPush(vStr,'~');
  }
  uVar3 = Gia_ObjCioId(pObj);
  Vec_StrPrintF(vStr,format,ppNamesIn[uVar3]);
  return;
}

Assistant:

void Gia_DeriveFormula_rec( Gia_Man_t * pGia, char ** ppNamesIn, Vec_Str_t * vStr, int iLit )
{
    Gia_Obj_t * pObj = Gia_ManObj( pGia, Abc_Lit2Var(iLit) );
    int fCompl = Abc_LitIsCompl(iLit);
    if ( Gia_ObjIsAnd(pObj) )
    {
        Vec_StrPush( vStr, '(' );
        if ( Gia_ObjIsMux(pGia, pObj) )
        {
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Gia_ObjFaninLit0p(pGia, pObj) );
            Vec_StrPush( vStr, '?' );
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Abc_LitNotCond( Gia_ObjFaninLit1p(pGia, pObj), fCompl ) );
            Vec_StrPush( vStr, ':' );
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Abc_LitNotCond( Gia_ObjFaninLit2p(pGia, pObj), fCompl ) );
        }
        else
        {
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Abc_LitNotCond( Gia_ObjFaninLit0p(pGia, pObj), fCompl ) );
            Vec_StrPush( vStr, (char)(Gia_ObjIsXor(pObj) ? '^' : (char)(fCompl ? '|' : '&')) );
            Gia_DeriveFormula_rec( pGia, ppNamesIn, vStr, Abc_LitNotCond( Gia_ObjFaninLit1p(pGia, pObj), fCompl ) );
        }
        Vec_StrPush( vStr, ')' );
    }
    else
    {
        if ( fCompl ) Vec_StrPush( vStr, '~' );
        Vec_StrPrintF( vStr, "%s", ppNamesIn[Gia_ObjCioId(pObj)] );
    }
}